

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_slow.c
# Opt level: O1

block_state deflate_slow(deflate_state *s,int flush)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  _func_uint32_t_deflate_state_ptr_Pos *p_Var4;
  ushort uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint insert_cnt;
  uint uVar10;
  uint uVar11;
  uchar *puVar12;
  
  p_Var4 = (&functable.longest_match)[0x400 < s->max_chain_length];
  do {
    if (s->lookahead < 0x106) {
      zng_fill_window(s);
      if (flush == 0 && s->lookahead < 0x106) {
        return need_more;
      }
      if (s->lookahead == 0) {
        if (s->match_available != 0) {
          bVar1 = s->window[s->strstart - 1];
          uVar6 = s->sym_next;
          s->d_buf[uVar6] = 0;
          s->sym_next = uVar6 + 1;
          s->l_buf[uVar6] = bVar1;
          s->dyn_ltree[bVar1].fc.freq = s->dyn_ltree[bVar1].fc.freq + 1;
          s->match_available = 0;
        }
        uVar6 = s->strstart;
        uVar9 = 2;
        if (uVar6 < 2) {
          uVar9 = uVar6;
        }
        s->insert = uVar9;
        if (flush == 4) {
          iVar3 = s->block_start;
          if ((long)iVar3 < 0) {
            puVar12 = (uchar *)0x0;
          }
          else {
            puVar12 = s->window + iVar3;
          }
          zng_tr_flush_block(s,(char *)puVar12,uVar6 - iVar3,1);
          s->block_start = s->strstart;
          zng_flush_pending(s->strm);
          return finish_done - (s->strm->avail_out == 0);
        }
        if (s->sym_next != 0) {
          iVar3 = s->block_start;
          if ((long)iVar3 < 0) {
            puVar12 = (uchar *)0x0;
          }
          else {
            puVar12 = s->window + iVar3;
          }
          zng_tr_flush_block(s,(char *)puVar12,uVar6 - iVar3,0);
          s->block_start = s->strstart;
          zng_flush_pending(s->strm);
          if (s->strm->avail_out == 0) {
            return need_more;
          }
        }
        return block_done;
      }
    }
    if (s->lookahead < 4) {
      uVar5 = 0;
    }
    else {
      uVar5 = (*s->quick_insert_string)(s,s->strstart);
    }
    s->prev_match = (Pos)s->match_start;
    uVar9 = 2;
    uVar6 = uVar9;
    if ((((((ulong)uVar5 < (ulong)s->strstart) &&
          ((long)((ulong)s->strstart - (ulong)uVar5) <= (long)(ulong)(s->w_size - 0x106))) &&
         (uVar5 != 0)) &&
        ((s->prev_length < s->max_lazy_match && (uVar6 = (*p_Var4)(s,uVar5), uVar6 < 6)))) &&
       (s->strategy == 1)) {
      uVar6 = uVar9;
    }
    uVar9 = s->prev_length;
    if ((uVar9 < 3) || (uVar9 < uVar6)) {
      if (s->match_available == 0) {
        s->prev_length = uVar6;
        s->match_available = 1;
        s->strstart = s->strstart + 1;
        s->lookahead = s->lookahead - 1;
      }
      else {
        bVar1 = s->window[s->strstart - 1];
        uVar9 = s->sym_next;
        s->d_buf[uVar9] = 0;
        s->sym_next = uVar9 + 1;
        s->l_buf[uVar9] = bVar1;
        s->dyn_ltree[bVar1].fc.freq = s->dyn_ltree[bVar1].fc.freq + 1;
        if (s->sym_next == s->sym_end) {
          iVar3 = s->block_start;
          if ((long)iVar3 < 0) {
            puVar12 = (uchar *)0x0;
          }
          else {
            puVar12 = s->window + iVar3;
          }
          zng_tr_flush_block(s,(char *)puVar12,s->strstart - iVar3,0);
          s->block_start = s->strstart;
          zng_flush_pending(s->strm);
        }
        s->prev_length = uVar6;
        s->strstart = s->strstart + 1;
        s->lookahead = s->lookahead - 1;
        if (s->strm->avail_out == 0) {
          return need_more;
        }
      }
    }
    else {
      uVar6 = s->lookahead;
      uVar2 = s->strstart;
      uVar5 = s->prev_match;
      uVar10 = s->sym_next;
      s->d_buf[uVar10] = (short)uVar2 + (short)~(uint)uVar5;
      s->sym_next = uVar10 + 1;
      s->l_buf[uVar10] = (uchar)(uVar9 - 3);
      s->matches = s->matches + 1;
      s->dyn_ltree[(ulong)""[uVar9 - 3] + 0x101].fc.freq =
           s->dyn_ltree[(ulong)""[uVar9 - 3] + 0x101].fc.freq + 1;
      uVar10 = (uVar2 + ~(uint)uVar5) - 1;
      uVar9 = (uVar10 >> 7) + 0x100;
      if (uVar10 < 0x100) {
        uVar9 = uVar10;
      }
      s->dyn_dtree[""[uVar9]].fc.freq = s->dyn_dtree[""[uVar9]].fc.freq + 1;
      uVar7 = (uVar6 + uVar2) - 3;
      uVar9 = s->sym_next;
      uVar2 = s->sym_end;
      uVar10 = s->strstart;
      uVar11 = s->prev_length;
      uVar6 = uVar11 - 1;
      s->prev_length = uVar6;
      s->lookahead = s->lookahead - uVar6;
      uVar8 = uVar7 - uVar10;
      if (uVar10 <= uVar7 && uVar8 != 0) {
        uVar11 = uVar11 - 2;
        if (uVar8 < uVar11) {
          uVar11 = uVar8;
        }
        (*s->insert_string)(s,uVar10 + 1,uVar11);
      }
      s->prev_length = 0;
      s->match_available = 0;
      uVar6 = uVar6 + s->strstart;
      s->strstart = uVar6;
      if (uVar9 == uVar2) {
        iVar3 = s->block_start;
        if ((long)iVar3 < 0) {
          puVar12 = (uchar *)0x0;
        }
        else {
          puVar12 = s->window + iVar3;
        }
        zng_tr_flush_block(s,(char *)puVar12,uVar6 - iVar3,0);
        s->block_start = s->strstart;
        zng_flush_pending(s->strm);
        if (s->strm->avail_out == 0) {
          return need_more;
        }
      }
    }
  } while( true );
}

Assistant:

Z_INTERNAL block_state deflate_slow(deflate_state *s, int flush) {
    Pos hash_head;           /* head of hash chain */
    int bflush;              /* set if current block must be flushed */
    int64_t dist;
    uint32_t match_len;
    match_func longest_match;

    if (s->max_chain_length <= 1024)
        longest_match = FUNCTABLE_FPTR(longest_match);
    else
        longest_match = FUNCTABLE_FPTR(longest_match_slow);

    /* Process the input block. */
    for (;;) {
        /* Make sure that we always have enough lookahead, except
         * at the end of the input file. We need STD_MAX_MATCH bytes
         * for the next match, plus WANT_MIN_MATCH bytes to insert the
         * string following the next match.
         */
        if (s->lookahead < MIN_LOOKAHEAD) {
            PREFIX(fill_window)(s);
            if (UNLIKELY(s->lookahead < MIN_LOOKAHEAD && flush == Z_NO_FLUSH)) {
                return need_more;
            }
            if (UNLIKELY(s->lookahead == 0))
                break; /* flush the current block */
        }

        /* Insert the string window[strstart .. strstart+2] in the
         * dictionary, and set hash_head to the head of the hash chain:
         */
        hash_head = 0;
        if (LIKELY(s->lookahead >= WANT_MIN_MATCH)) {
            hash_head = s->quick_insert_string(s, s->strstart);
        }

        /* Find the longest match, discarding those <= prev_length.
         */
        s->prev_match = (Pos)s->match_start;
        match_len = STD_MIN_MATCH - 1;
        dist = (int64_t)s->strstart - hash_head;

        if (dist <= MAX_DIST(s) && dist > 0 && s->prev_length < s->max_lazy_match && hash_head != 0) {
            /* To simplify the code, we prevent matches with the string
             * of window index 0 (in particular we have to avoid a match
             * of the string with itself at the start of the input file).
             */
            match_len = longest_match(s, hash_head);
            /* longest_match() sets match_start */

            if (match_len <= 5 && (s->strategy == Z_FILTERED)) {
                /* If prev_match is also WANT_MIN_MATCH, match_start is garbage
                 * but we will ignore the current match anyway.
                 */
                match_len = STD_MIN_MATCH - 1;
            }
        }
        /* If there was a match at the previous step and the current
         * match is not better, output the previous match:
         */
        if (s->prev_length >= STD_MIN_MATCH && match_len <= s->prev_length) {
            unsigned int max_insert = s->strstart + s->lookahead - STD_MIN_MATCH;
            /* Do not insert strings in hash table beyond this. */

            Assert((s->strstart-1) <= UINT16_MAX, "strstart-1 should fit in uint16_t");
            check_match(s, (Pos)(s->strstart - 1), s->prev_match, s->prev_length);

            bflush = zng_tr_tally_dist(s, s->strstart -1 - s->prev_match, s->prev_length - STD_MIN_MATCH);

            /* Insert in hash table all strings up to the end of the match.
             * strstart-1 and strstart are already inserted. If there is not
             * enough lookahead, the last two strings are not inserted in
             * the hash table.
             */
            s->prev_length -= 1;
            s->lookahead -= s->prev_length;

            unsigned int mov_fwd = s->prev_length - 1;
            if (max_insert > s->strstart) {
                unsigned int insert_cnt = mov_fwd;
                if (UNLIKELY(insert_cnt > max_insert - s->strstart))
                    insert_cnt = max_insert - s->strstart;
                s->insert_string(s, s->strstart + 1, insert_cnt);
            }
            s->prev_length = 0;
            s->match_available = 0;
            s->strstart += mov_fwd + 1;

            if (UNLIKELY(bflush))
                FLUSH_BLOCK(s, 0);

        } else if (s->match_available) {
            /* If there was no match at the previous position, output a
             * single literal. If there was a match but the current match
             * is longer, truncate the previous match to a single literal.
             */
            bflush = zng_tr_tally_lit(s, s->window[s->strstart-1]);
            if (UNLIKELY(bflush))
                FLUSH_BLOCK_ONLY(s, 0);
            s->prev_length = match_len;
            s->strstart++;
            s->lookahead--;
            if (UNLIKELY(s->strm->avail_out == 0))
                return need_more;
        } else {
            /* There is no previous match to compare with, wait for
             * the next step to decide.
             */
            s->prev_length = match_len;
            s->match_available = 1;
            s->strstart++;
            s->lookahead--;
        }
    }
    Assert(flush != Z_NO_FLUSH, "no flush?");
    if (UNLIKELY(s->match_available)) {
        Z_UNUSED(zng_tr_tally_lit(s, s->window[s->strstart-1]));
        s->match_available = 0;
    }
    s->insert = s->strstart < (STD_MIN_MATCH - 1) ? s->strstart : (STD_MIN_MATCH - 1);
    if (UNLIKELY(flush == Z_FINISH)) {
        FLUSH_BLOCK(s, 1);
        return finish_done;
    }
    if (UNLIKELY(s->sym_next))
        FLUSH_BLOCK(s, 0);
    return block_done;
}